

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulate.cc
# Opt level: O0

bool sfm::is_consistent_pose(Correspondence2D2D *match,CameraPose *pose1,CameraPose *pose2)

{
  double *pdVar1;
  bool local_99;
  Vector<double,_3> local_98;
  undefined1 local_80 [8];
  Vector<double,_3> x2;
  undefined1 local_50 [8];
  Vector<double,_3> x1;
  Vector<double,_3> x;
  CameraPose *pose2_local;
  CameraPose *pose1_local;
  Correspondence2D2D *match_local;
  
  triangulate_match((Vector<double,_3> *)(x1.v + 2),match,pose1,pose2);
  math::Matrix<double,_3,_3>::operator*
            ((Vector<double,_3> *)(x2.v + 2),&pose1->R,(Vector<double,_3> *)(x1.v + 2));
  math::Vector<double,_3>::operator+
            ((Vector<double,_3> *)local_50,(Vector<double,_3> *)(x2.v + 2),&pose1->t);
  math::Matrix<double,_3,_3>::operator*(&local_98,&pose2->R,(Vector<double,_3> *)(x1.v + 2));
  math::Vector<double,_3>::operator+((Vector<double,_3> *)local_80,&local_98,&pose2->t);
  pdVar1 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_50,2);
  local_99 = false;
  if (0.0 < *pdVar1) {
    pdVar1 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)local_80,2);
    local_99 = 0.0 < *pdVar1;
  }
  return local_99;
}

Assistant:

bool
is_consistent_pose (Correspondence2D2D const& match,
    CameraPose const& pose1, CameraPose const& pose2)
{
    math::Vector<double, 3> x = triangulate_match(match, pose1, pose2);
    math::Vector<double, 3> x1 = pose1.R * x + pose1.t;
    math::Vector<double, 3> x2 = pose2.R * x + pose2.t;
    return x1[2] > 0.0f && x2[2] > 0.0f;
}